

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O3

void __thiscall
mp::internal::NLFileReader<MockFile>::Open(NLFileReader<MockFile> *this,CStringRef filename)

{
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  undefined4 extraout_var;
  AssertionFailure *this_00;
  ulong uVar4;
  ulong uVar5;
  MockFile local_140;
  
  MockFile::MockFile(&local_140,filename,0);
  testing::internal::FunctionMockerBase<unsigned_long_(void_*,_unsigned_long)>::~FunctionMockerBase
            (&local_140.gmockconst2_read_37.
              super_FunctionMockerBase<unsigned_long_(void_*,_unsigned_long)>);
  testing::internal::FunctionMockerBase<long_long_()>::~FunctionMockerBase
            (&local_140.gmockconst0_size_36.super_FunctionMockerBase<long_long_()>);
  testing::internal::FunctionMockerBase<int_()>::~FunctionMockerBase
            ((FunctionMockerBase<int_()> *)&local_140);
  sVar3 = MockFile::size(&this->file_);
  if (-1 < (long)sVar3) {
    this->size_ = sVar3;
    iVar2 = fmt::getpagesize();
    uVar1 = this->size_;
    uVar5 = uVar1 % CONCAT44(extraout_var,iVar2);
    uVar4 = (CONCAT44(extraout_var,iVar2) + uVar1) - uVar5;
    if (uVar5 == 0) {
      uVar4 = uVar1;
    }
    this->rounded_size_ = uVar4;
    return;
  }
  this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
  AssertionFailure::AssertionFailure(this_00,"negative file size");
  __cxa_throw(this_00,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void mp::internal::NLFileReader<File>::Open(fmt::CStringRef filename) {
  file_ = File(filename, fmt::File::RDONLY | fmt::File::BINARY);
  size_ = ConvertFileToMmapSize(file_.size(), filename);
  // Round size up to a multiple of page_size. The remainded of the last
  // partial page is zero-filled both on POSIX and Windows so the resulting
  // memory buffer is zero terminated.
  std::size_t page_size = fmt::getpagesize();
  std::size_t remainder = size_ % page_size;
  rounded_size_ = remainder != 0 ? (size_ + page_size - remainder) : size_;
}